

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcLaborResource::~IfcLaborResource(IfcLaborResource *this)

{
  ~IfcLaborResource((IfcLaborResource *)&this[-1].super_IfcConstructionResource.field_0x50);
  return;
}

Assistant:

IfcLaborResource() : Object("IfcLaborResource") {}